

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O2

void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *p,int NodeId)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *pGVar2;
  uint __line;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar7;
  abctime aVar8;
  char *__assertion;
  int local_68;
  int local_64;
  int local_60;
  lit local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  abctime local_48;
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  
  if (NodeId < 1) {
    __assert_fail("NodeId > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,0xd5,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
  }
  iVar3 = Ssc_ObjSatVar(p,NodeId);
  if (iVar3 == 0) {
    local_48 = Abc_Clock();
    pVVar1 = p->vFront;
    pVVar1->nSize = 0;
    Ssc_ManCnfAddToFrontier(p,NodeId,pVVar1);
    iVar3 = 0;
    while (iVar3 < p->vFront->nSize) {
      pGVar2 = p->pFraig;
      iVar4 = Vec_IntEntry(p->vFront,iVar3);
      pObj = Gia_ManObj(pGVar2,iVar4);
      if (pObj == (Gia_Obj_t *)0x0) break;
      iVar4 = Gia_ObjId(p->pFraig,pObj);
      iVar4 = Ssc_ObjSatVar(p,iVar4);
      if (iVar4 == 0) {
        __assert_fail("Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pNode))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                      ,0xe1,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
      }
      iVar4 = Gia_ObjIsMuxType(pObj);
      if (iVar4 == 0) {
        if (((ulong)pObj & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,0xb2,"void Ssc_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        if (((int)(uint)*(undefined8 *)pObj < 0) ||
           (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,0xb3,"void Ssc_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        pGVar2 = p->pFraig;
        pVVar1 = p->vFanins;
        pVVar1->nSize = 0;
        Ssc_ManCollectSuper_rec
                  (pGVar2,(Gia_Obj_t *)
                          ((ulong)((uint)*(undefined8 *)pObj >> 0x1d & 1) |
                          (ulong)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff))),pVVar1);
        pGVar7 = Gia_ObjChild1(pObj);
        Ssc_ManCollectSuper_rec(pGVar2,pGVar7,pVVar1);
        for (iVar4 = 0; pVVar1 = p->vFanins, iVar4 < pVVar1->nSize; iVar4 = iVar4 + 1) {
          iVar5 = Vec_IntEntry(pVVar1,iVar4);
          iVar5 = Abc_Lit2Var(iVar5);
          Ssc_ManCnfAddToFrontier(p,iVar5,p->vFront);
        }
        if (((int)(uint)*(undefined8 *)pObj < 0) ||
           (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd( pNode )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,0x84,"void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        iVar4 = Gia_Obj2Lit(p->pFraig,pObj);
        iVar4 = Ssc_ObjSatLit(p,iVar4);
        for (iVar5 = 0; iVar5 < pVVar1->nSize; iVar5 = iVar5 + 1) {
          iVar6 = Vec_IntEntry(pVVar1,iVar5);
          local_68 = Ssc_ObjSatLit(p,iVar6);
          local_64 = Abc_LitNot(iVar4);
          iVar6 = sat_solver_addclause(p->pSat,&local_68,&local_60);
          if (iVar6 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x8e,"void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                         );
          }
          iVar6 = Abc_LitNot(local_68);
          Vec_IntWriteEntry(pVVar1,iVar5,iVar6);
        }
        Vec_IntPush(pVVar1,iVar4);
        iVar4 = sat_solver_addclause(p->pSat,pVVar1->pArray,pVVar1->pArray + pVVar1->nSize);
        if (iVar4 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,0x95,"void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
      }
      else {
        pVVar1 = p->vFanins;
        pVVar1->nSize = 0;
        iVar4 = Gia_ObjFaninId0p(p->pFraig,pObj + -(*(ulong *)pObj & 0x1fffffff));
        Vec_IntPushUnique(pVVar1,iVar4);
        pVVar1 = p->vFanins;
        iVar4 = Gia_ObjFaninId0p(p->pFraig,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
        Vec_IntPushUnique(pVVar1,iVar4);
        pVVar1 = p->vFanins;
        iVar4 = Gia_ObjFaninId1p(p->pFraig,pObj + -(*(ulong *)pObj & 0x1fffffff));
        Vec_IntPushUnique(pVVar1,iVar4);
        pVVar1 = p->vFanins;
        iVar4 = Gia_ObjFaninId1p(p->pFraig,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
        Vec_IntPushUnique(pVVar1,iVar4);
        for (iVar4 = 0; iVar4 < p->vFanins->nSize; iVar4 = iVar4 + 1) {
          iVar5 = Vec_IntEntry(p->vFanins,iVar4);
          Ssc_ManCnfAddToFrontier(p,iVar5,p->vFront);
        }
        if (((ulong)pObj & 1) != 0) {
          __assertion = "!Gia_IsComplement( pNode )";
          __line = 0x35;
LAB_00515fe5:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,__line,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
        }
        local_58 = iVar3;
        iVar3 = Gia_ObjIsMuxType(pObj);
        if (iVar3 == 0) {
          __assertion = "Gia_ObjIsMuxType( pNode )";
          __line = 0x36;
          goto LAB_00515fe5;
        }
        pGVar7 = Gia_ObjRecognizeMux(pObj,&pNodeT,&pNodeE);
        iVar3 = Gia_Obj2Lit(p->pFraig,pObj);
        iVar4 = Ssc_ObjSatLit(p,iVar3);
        iVar3 = Gia_Obj2Lit(p->pFraig,pGVar7);
        iVar3 = Ssc_ObjSatLit(p,iVar3);
        iVar5 = Gia_Obj2Lit(p->pFraig,pNodeT);
        iVar5 = Ssc_ObjSatLit(p,iVar5);
        iVar6 = Gia_Obj2Lit(p->pFraig,pNodeE);
        local_4c = Ssc_ObjSatLit(p,iVar6);
        local_68 = Abc_LitNotCond(iVar3,1);
        local_64 = Abc_LitNotCond(iVar5,1);
        local_60 = Abc_LitNotCond(iVar4,0);
        iVar6 = sat_solver_addclause(p->pSat,&local_68,&local_5c);
        if (iVar6 == 0) {
          __assertion = "RetValue";
          __line = 0x4b;
          goto LAB_00515fe5;
        }
        local_68 = Abc_LitNotCond(iVar3,1);
        local_64 = Abc_LitNotCond(iVar5,0);
        local_60 = Abc_LitNotCond(iVar4,1);
        iVar6 = sat_solver_addclause(p->pSat,&local_68,&local_5c);
        if (iVar6 == 0) {
          __assertion = "RetValue";
          __line = 0x50;
          goto LAB_00515fe5;
        }
        local_50 = iVar5;
        local_68 = Abc_LitNotCond(iVar3,0);
        iVar5 = local_4c;
        local_64 = Abc_LitNotCond(local_4c,1);
        local_60 = Abc_LitNotCond(iVar4,0);
        iVar6 = sat_solver_addclause(p->pSat,&local_68,&local_5c);
        if (iVar6 == 0) {
          __assertion = "RetValue";
          __line = 0x55;
          goto LAB_00515fe5;
        }
        local_68 = Abc_LitNotCond(iVar3,0);
        local_64 = Abc_LitNotCond(iVar5,0);
        local_60 = Abc_LitNotCond(iVar4,1);
        iVar3 = sat_solver_addclause(p->pSat,&local_68,&local_5c);
        iVar6 = local_50;
        if (iVar3 == 0) {
          __assertion = "RetValue";
          __line = 0x5a;
          goto LAB_00515fe5;
        }
        iVar3 = local_58;
        if (local_50 != iVar5) {
          local_68 = Abc_LitNotCond(local_50,0);
          local_64 = Abc_LitNotCond(iVar5,0);
          local_54 = iVar4;
          local_60 = Abc_LitNotCond(iVar4,1);
          iVar3 = sat_solver_addclause(p->pSat,&local_68,&local_5c);
          if (iVar3 == 0) {
            __assertion = "RetValue";
            __line = 0x6d;
            goto LAB_00515fe5;
          }
          local_68 = Abc_LitNotCond(iVar6,1);
          local_64 = Abc_LitNotCond(iVar5,1);
          local_60 = Abc_LitNotCond(local_54,0);
          iVar4 = sat_solver_addclause(p->pSat,&local_68,&local_5c);
          iVar3 = local_58;
          if (iVar4 == 0) {
            __assertion = "RetValue";
            __line = 0x72;
            goto LAB_00515fe5;
          }
        }
      }
      iVar3 = iVar3 + 1;
      if (p->vFanins->nSize < 2) {
        __assert_fail("Vec_IntSize(p->vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                      ,0xf4,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
      }
    }
    aVar8 = Abc_Clock();
    p->timeCnfGen = p->timeCnfGen + (aVar8 - local_48);
  }
  return;
}

Assistant:

static void Ssc_ManCnfNodeAddToSolver( Ssc_Man_t * p, int NodeId )
{
    Gia_Obj_t * pNode;
    int i, k, Id, Lit;
    abctime clk;
    assert( NodeId > 0 );
    // quit if CNF is ready
    if ( Ssc_ObjSatVar(p, NodeId) )
        return;
clk = Abc_Clock();
    // start the frontier
    Vec_IntClear( p->vFront );
    Ssc_ManCnfAddToFrontier( p, NodeId, p->vFront );
    // explore nodes in the frontier
    Gia_ManForEachObjVec( p->vFront, p->pFraig, pNode, i )
    {
        // create the supergate
        assert( Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pNode)) );
        if ( Gia_ObjIsMuxType(pNode) )
        {
            Vec_IntClear( p->vFanins );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId0p( p->pFraig, Gia_ObjFanin0(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId0p( p->pFraig, Gia_ObjFanin1(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId1p( p->pFraig, Gia_ObjFanin0(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId1p( p->pFraig, Gia_ObjFanin1(pNode) ) );
            Vec_IntForEachEntry( p->vFanins, Id, k )
                Ssc_ManCnfAddToFrontier( p, Id, p->vFront );
            Gia_ManAddClausesMux( p, pNode );
        }
        else
        {
            Ssc_ManCollectSuper( p->pFraig, pNode, p->vFanins );
            Vec_IntForEachEntry( p->vFanins, Lit, k )
                Ssc_ManCnfAddToFrontier( p, Abc_Lit2Var(Lit), p->vFront );
            Gia_ManAddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_IntSize(p->vFanins) > 1 );
    }
p->timeCnfGen += Abc_Clock() - clk;
}